

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O3

bool __thiscall hwtest::pgraph::MthdD3D6StencilFunc::is_valid_val(MthdD3D6StencilFunc *this)

{
  uint uVar1;
  
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  return (ulong)(uVar1 >> 4 & 0xf) - 1 < 8 && (uVar1 & 0xe) == 0;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 1, 3))
			return false;
		if (extr(val, 4, 4) < 1 || extr(val, 4, 4) > 8)
			return false;
		return true;
	}